

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstring.cpp
# Opt level: O3

void __thiscall FString::ReplaceChars(FString *this,char *oldcharset,char newchar)

{
  uint uVar1;
  char *pcVar2;
  char *pcVar3;
  ulong uVar4;
  
  if ((oldcharset != (char *)0x0) && (*oldcharset != '\0')) {
    LockBuffer(this);
    uVar1 = *(uint *)(this->Chars + -0xc);
    if ((ulong)uVar1 != 0) {
      uVar4 = 0;
      do {
        pcVar2 = this->Chars;
        pcVar3 = strchr(oldcharset,(int)pcVar2[uVar4]);
        if (pcVar3 != (char *)0x0) {
          pcVar2[uVar4] = newchar;
        }
        uVar4 = uVar4 + 1;
      } while (uVar1 != uVar4);
    }
    UnlockBuffer(this);
    return;
  }
  return;
}

Assistant:

void FString::ReplaceChars (const char *oldcharset, char newchar)
{
	if (oldcharset == NULL || oldcharset[0] == '\0')
		return;

	ReplaceChars([&oldcharset](char c){ return strchr(oldcharset, c) != NULL; }, newchar);
}